

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O2

void __thiscall JSON::JSON_number::~JSON_number(JSON_number *this)

{
  ~JSON_number(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~JSON_number() override = default;